

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::ImageDataParameter::InternalSerializeWithCachedSizesToArray
          (ImageDataParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  uint uVar2;
  string *psVar3;
  void *pvVar4;
  bool bVar5;
  uint8 *puVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    psVar3 = (this->source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.ImageDataParameter.source");
    psVar3 = (this->source_).ptr_;
    *target = '\n';
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  if ((uVar2 >> 10 & 1) != 0) {
    fVar1 = this->scale_;
    *target = 0x15;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 2) != 0) {
    psVar3 = (this->mean_file_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.ImageDataParameter.mean_file");
    psVar3 = (this->mean_file_).ptr_;
    *target = 0x1a;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    uVar7 = this->batch_size_;
    *target = 0x20;
    pbVar9 = target + 1;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar9 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar5);
    }
    *pbVar9 = (byte)uVar8;
    target = pbVar9 + 1;
  }
  if ((uVar2 & 8) != 0) {
    uVar7 = this->crop_size_;
    *target = 0x28;
    pbVar9 = target + 1;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar9 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar5);
    }
    *pbVar9 = (byte)uVar8;
    target = pbVar9 + 1;
  }
  if ((uVar2 & 0x40) != 0) {
    bVar5 = this->mirror_;
    *target = 0x30;
    target[1] = bVar5;
    target = target + 2;
  }
  if ((uVar2 & 0x10) != 0) {
    uVar7 = this->rand_skip_;
    *target = 0x38;
    pbVar9 = target + 1;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar9 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar5);
    }
    *pbVar9 = (byte)uVar8;
    target = pbVar9 + 1;
  }
  if ((uVar2 & 0x20) != 0) {
    bVar5 = this->shuffle_;
    *target = 0x40;
    target[1] = bVar5;
    target = target + 2;
  }
  if ((char)uVar2 < '\0') {
    uVar7 = this->new_height_;
    *target = 0x48;
    pbVar9 = target + 1;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar9 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar5);
    }
    *pbVar9 = (byte)uVar8;
    target = pbVar9 + 1;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    uVar7 = this->new_width_;
    *target = 0x50;
    pbVar9 = target + 1;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar9 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar5);
    }
    *pbVar9 = (byte)uVar8;
    target = pbVar9 + 1;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    bVar5 = this->is_color_;
    *target = 0x58;
    target[1] = bVar5;
    target = target + 2;
  }
  if ((uVar2 & 4) != 0) {
    psVar3 = (this->root_folder_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.ImageDataParameter.root_folder");
    psVar3 = (this->root_folder_).ptr_;
    *target = 0x62;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    puVar6 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ImageDataParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ImageDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.source");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->source(), target);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->scale(), target);
  }

  // optional string mean_file = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.mean_file");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->mean_file(), target);
  }

  // optional uint32 batch_size = 4 [default = 1];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4, this->batch_size(), target);
  }

  // optional uint32 crop_size = 5 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5, this->crop_size(), target);
  }

  // optional bool mirror = 6 [default = false];
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(6, this->mirror(), target);
  }

  // optional uint32 rand_skip = 7 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(7, this->rand_skip(), target);
  }

  // optional bool shuffle = 8 [default = false];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(8, this->shuffle(), target);
  }

  // optional uint32 new_height = 9 [default = 0];
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9, this->new_height(), target);
  }

  // optional uint32 new_width = 10 [default = 0];
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->new_width(), target);
  }

  // optional bool is_color = 11 [default = true];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(11, this->is_color(), target);
  }

  // optional string root_folder = 12 [default = ""];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->root_folder().data(), this->root_folder().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.root_folder");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        12, this->root_folder(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ImageDataParameter)
  return target;
}